

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btBox2dBox2dCollisionAlgorithm.cpp
# Opt level: O3

btScalar EdgeSeparation(btBox2dShape *poly1,btTransform *xf1,int edge1,btBox2dShape *poly2,
                       btTransform *xf2)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  btScalar *pbVar23;
  int iVar24;
  ulong uVar25;
  ulong uVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  
  fVar1 = (xf1->m_basis).m_el[0].m_floats[0];
  fVar2 = (xf1->m_basis).m_el[0].m_floats[1];
  fVar3 = poly1->m_normals[edge1].m_floats[0];
  fVar4 = poly1->m_normals[edge1].m_floats[1];
  fVar5 = (xf1->m_basis).m_el[0].m_floats[2];
  fVar6 = poly1->m_normals[edge1].m_floats[2];
  fVar28 = fVar5 * fVar6 + fVar1 * fVar3 + fVar2 * fVar4;
  fVar7 = (xf1->m_basis).m_el[1].m_floats[0];
  fVar8 = (xf1->m_basis).m_el[1].m_floats[1];
  fVar9 = (xf1->m_basis).m_el[1].m_floats[2];
  fVar30 = fVar9 * fVar6 + fVar7 * fVar3 + fVar4 * fVar8;
  fVar10 = (xf1->m_basis).m_el[2].m_floats[0];
  fVar11 = (xf1->m_basis).m_el[2].m_floats[1];
  fVar12 = (xf1->m_basis).m_el[2].m_floats[2];
  fVar27 = fVar6 * fVar12 + fVar3 * fVar10 + fVar4 * fVar11;
  fVar3 = (xf2->m_basis).m_el[0].m_floats[0];
  fVar4 = (xf2->m_basis).m_el[1].m_floats[0];
  fVar6 = (xf2->m_basis).m_el[2].m_floats[0];
  fVar13 = (xf2->m_basis).m_el[1].m_floats[1];
  fVar14 = (xf2->m_basis).m_el[0].m_floats[1];
  fVar15 = (xf2->m_basis).m_el[2].m_floats[1];
  fVar16 = (xf2->m_basis).m_el[1].m_floats[2];
  fVar17 = (xf2->m_basis).m_el[0].m_floats[2];
  fVar18 = (xf2->m_basis).m_el[2].m_floats[2];
  pbVar23 = poly2->m_vertices[0].m_floats + 2;
  uVar25 = 0xffffffff;
  uVar26 = 0;
  fVar31 = 3.4028235e+38;
  do {
    fVar29 = *pbVar23 * (fVar18 * fVar27 + fVar17 * fVar28 + fVar30 * fVar16) +
             ((btVector3 *)(pbVar23 + -2))->m_floats[0] *
             (fVar6 * fVar27 + fVar3 * fVar28 + fVar30 * fVar4) +
             pbVar23[-1] * (fVar15 * fVar27 + fVar14 * fVar28 + fVar30 * fVar13);
    if (fVar29 < fVar31) {
      uVar25 = uVar26 & 0xffffffff;
      fVar31 = fVar29;
    }
    uVar26 = uVar26 + 1;
    pbVar23 = pbVar23 + 4;
  } while (uVar26 != 4);
  iVar24 = (int)uVar25;
  fVar31 = poly1->m_vertices[edge1].m_floats[0];
  fVar29 = poly2->m_vertices[iVar24].m_floats[0];
  fVar19 = poly1->m_vertices[edge1].m_floats[1];
  fVar20 = poly2->m_vertices[iVar24].m_floats[1];
  fVar21 = poly1->m_vertices[edge1].m_floats[2];
  fVar22 = poly2->m_vertices[iVar24].m_floats[2];
  return (((xf2->m_origin).m_floats[2] + fVar18 * fVar22 + fVar6 * fVar29 + fVar15 * fVar20) -
         ((xf1->m_origin).m_floats[2] + fVar12 * fVar21 + fVar10 * fVar31 + fVar11 * fVar19)) *
         fVar27 + (((xf2->m_origin).m_floats[0] + fVar17 * fVar22 + fVar3 * fVar29 + fVar14 * fVar20
                   ) - ((xf1->m_origin).m_floats[0] +
                       fVar5 * fVar21 + fVar1 * fVar31 + fVar2 * fVar19)) * fVar28 +
                  fVar30 * (((xf2->m_origin).m_floats[1] +
                            fVar16 * fVar22 + fVar4 * fVar29 + fVar13 * fVar20) -
                           ((xf1->m_origin).m_floats[1] +
                           fVar9 * fVar21 + fVar7 * fVar31 + fVar8 * fVar19));
}

Assistant:

static btScalar EdgeSeparation(const btBox2dShape* poly1, const btTransform& xf1, int edge1,
							  const btBox2dShape* poly2, const btTransform& xf2)
{
	const btVector3* vertices1 = poly1->getVertices();
	const btVector3* normals1 = poly1->getNormals();

	int count2 = poly2->getVertexCount();
	const btVector3* vertices2 = poly2->getVertices();

	btAssert(0 <= edge1 && edge1 < poly1->getVertexCount());

	// Convert normal from poly1's frame into poly2's frame.
	btVector3 normal1World = b2Mul(xf1.getBasis(), normals1[edge1]);
	btVector3 normal1 = b2MulT(xf2.getBasis(), normal1World);

	// Find support vertex on poly2 for -normal.
	int index = 0;
	btScalar minDot = BT_LARGE_FLOAT;

    if( count2 > 0 )
        index = (int) normal1.minDot( vertices2, count2, minDot);

	btVector3 v1 = b2Mul(xf1, vertices1[edge1]);
	btVector3 v2 = b2Mul(xf2, vertices2[index]);
	btScalar separation = b2Dot(v2 - v1, normal1World);
	return separation;
}